

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalUnnest::Deserialize(LogicalUnnest *this,Deserializer *deserializer)

{
  unsigned_long unnest_index;
  tuple<duckdb::LogicalUnnest_*,_std::default_delete<duckdb::LogicalUnnest>_> this_00;
  pointer pLVar1;
  pointer *__ptr;
  __uniq_ptr_impl<duckdb::LogicalUnnest,_std::default_delete<duckdb::LogicalUnnest>_> local_28;
  
  unnest_index = Deserializer::ReadPropertyWithDefault<unsigned_long>
                           (deserializer,200,"unnest_index");
  this_00.
  super__Tuple_impl<0UL,_duckdb::LogicalUnnest_*,_std::default_delete<duckdb::LogicalUnnest>_>.
  super__Head_base<0UL,_duckdb::LogicalUnnest_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::LogicalUnnest_*,_std::default_delete<duckdb::LogicalUnnest>_>)
       operator_new(0x70);
  LogicalUnnest((LogicalUnnest *)
                this_00.
                super__Tuple_impl<0UL,_duckdb::LogicalUnnest_*,_std::default_delete<duckdb::LogicalUnnest>_>
                .super__Head_base<0UL,_duckdb::LogicalUnnest_*,_false>._M_head_impl,unnest_index);
  local_28._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalUnnest_*,_std::default_delete<duckdb::LogicalUnnest>_>.
  super__Head_base<0UL,_duckdb::LogicalUnnest_*,_false>._M_head_impl =
       (tuple<duckdb::LogicalUnnest_*,_std::default_delete<duckdb::LogicalUnnest>_>)
       (tuple<duckdb::LogicalUnnest_*,_std::default_delete<duckdb::LogicalUnnest>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::LogicalUnnest_*,_std::default_delete<duckdb::LogicalUnnest>_>.
       super__Head_base<0UL,_duckdb::LogicalUnnest_*,_false>._M_head_impl;
  pLVar1 = unique_ptr<duckdb::LogicalUnnest,_std::default_delete<duckdb::LogicalUnnest>,_true>::
           operator->((unique_ptr<duckdb::LogicalUnnest,_std::default_delete<duckdb::LogicalUnnest>,_true>
                       *)&local_28);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xc9,"expressions",&(pLVar1->super_LogicalOperator).expressions);
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)
       local_28._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalUnnest_*,_std::default_delete<duckdb::LogicalUnnest>_>.
       super__Head_base<0UL,_duckdb::LogicalUnnest_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalUnnest::Deserialize(Deserializer &deserializer) {
	auto unnest_index = deserializer.ReadPropertyWithDefault<idx_t>(200, "unnest_index");
	auto result = duckdb::unique_ptr<LogicalUnnest>(new LogicalUnnest(unnest_index));
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(201, "expressions", result->expressions);
	return std::move(result);
}